

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  uint uVar1;
  ZSTD_matchState_t *ms;
  ZSTD_compressedBlockState_t *in_RDX;
  ZSTD_CCtx_s *in_RDI;
  ZSTD_tableFillPurpose_e in_R8D;
  long in_R9;
  long in_stack_00000008;
  ulong in_stack_00000010;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  size_t dictContentSize;
  ZSTD_buffered_policy_e in_stack_000000f8;
  ZSTD_compResetPolicy_e in_stack_000000fc;
  size_t in_stack_00000100;
  U64 in_stack_00000108;
  ZSTD_CCtx_params *in_stack_00000110;
  ZSTD_CCtx *in_stack_00000118;
  ZSTD_buffered_policy_e in_stack_0000020c;
  U64 in_stack_00000210;
  ZSTD_CCtx_params *in_stack_00000218;
  ZSTD_CDict *in_stack_00000220;
  ZSTD_CCtx *in_stack_00000228;
  uint in_stack_ffffffffffffff74;
  ZSTD_cwksp *in_stack_ffffffffffffff80;
  ldmState_t *in_stack_ffffffffffffff88;
  ZSTD_compressedBlockState_t *bs;
  ZSTD_compressedBlockState_t *pZVar2;
  size_t local_18;
  
  bs = in_RDX;
  if (in_R9 != 0) {
    bs = *(ZSTD_compressedBlockState_t **)(in_R9 + 8);
  }
  pZVar2 = bs;
  ms = (ZSTD_matchState_t *)duckdb_zstd::ZSTD_trace_compress_begin(in_RDI);
  in_RDI->traceCtx = (ZSTD_TraceCtx)ms;
  if ((((in_R9 == 0) || (*(long *)(in_R9 + 8) == 0)) ||
      ((0x1ffff < in_stack_00000010 &&
       ((((ulong)(*(long *)(in_R9 + 8) * 6) <= in_stack_00000010 &&
         (in_stack_00000010 != 0xffffffffffffffff)) && (*(int *)(in_R9 + 0x17b4) != 0)))))) ||
     (*(int *)(in_stack_00000008 + 0x44) == 3)) {
    local_18 = ZSTD_resetCCtx_internal
                         (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                          in_stack_000000fc,in_stack_000000f8);
    uVar1 = ERR_isError(local_18);
    if (uVar1 == 0) {
      if (in_R9 == 0) {
        local_18 = ZSTD_compress_insertDictionary
                             (bs,ms,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ZSTD_CCtx_params *)in_RDI->entropyWorkspace,
                              (void *)((ulong)in_stack_ffffffffffffff74 << 0x20),local_18,
                              (ZSTD_dictContentType_e)pZVar2,(ZSTD_dictTableLoadMethod_e)in_R9,
                              in_R8D,in_RDX);
      }
      else {
        local_18 = ZSTD_compress_insertDictionary
                             (bs,ms,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ZSTD_CCtx_params *)in_RDI->entropyWorkspace,
                              (void *)((ulong)in_stack_ffffffffffffff74 << 0x20),local_18,
                              (ZSTD_dictContentType_e)pZVar2,(ZSTD_dictTableLoadMethod_e)in_R9,
                              in_R8D,in_RDX);
      }
      uVar1 = ERR_isError(local_18);
      if (uVar1 == 0) {
        in_RDI->dictID = (U32)local_18;
        in_RDI->dictContentSize = (size_t)pZVar2;
        local_18 = 0;
      }
    }
  }
  else {
    local_18 = ZSTD_resetCCtx_usingCDict
                         (in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000210,
                          in_stack_0000020c);
  }
  return local_18;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}